

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_detection.cpp
# Opt level: O3

void __thiscall
duckdb::ReplaceNames
          (duckdb *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *detected_names,CSVStateMachine *state_machine,
          unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
          *best_sql_types_candidates_per_column_idx,CSVReaderOptions *options,
          MultiFileOptions *file_options,vector<duckdb::HeaderValue,_true> *best_header_row,
          CSVErrorHandler *error_handler)

{
  pointer pbVar1;
  ulong uVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  ulong uVar6;
  size_type sVar7;
  size_type sVar8;
  idx_t col_number;
  pointer column_count;
  initializer_list<duckdb::LogicalType> __l;
  CSVError error;
  allocator_type local_121;
  pointer local_120;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_f0;
  CSVStateMachine *local_e8;
  LogicalType local_e0;
  CSVError local_c8;
  
  if (*(char *)&best_sql_types_candidates_per_column_idx[6]._M_h._M_single_bucket == '\0') {
    if (((((ulong)options & 1) == 0) && (((ulong)file_options & 1) == 0)) &&
       (*(char *)&best_sql_types_candidates_per_column_idx[0x12]._M_h._M_before_begin._M_nxt !=
        '\x01')) {
      sVar5 = best_sql_types_candidates_per_column_idx[6]._M_h._M_element_count;
      sVar7 = *(size_type *)&best_sql_types_candidates_per_column_idx[6]._M_h._M_rehash_policy;
      column_count = (pointer)((long)(sVar7 - sVar5) >> 5);
      pbVar1 = detected_names[5].
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_e8 = state_machine;
      if (pbVar1 < column_count) {
        if (*(char *)&best_sql_types_candidates_per_column_idx[0xc]._M_h._M_rehash_policy.
                      _M_max_load_factor == '\x01') {
          col_number = 0;
          local_120 = pbVar1;
          local_f0 = detected_names;
          do {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"column","");
            GenerateColumnName(&local_c8.error_message,(idx_t)column_count,col_number,&local_118);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                       &local_c8.error_message);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8.error_message._M_dataplus._M_p != &local_c8.error_message.field_2) {
              operator_delete(local_c8.error_message._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            LogicalType::LogicalType(&local_e0,VARCHAR);
            __l._M_len = 1;
            __l._M_array = &local_e0;
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       &local_118,__l,&local_121);
            pmVar4 = ::std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_e8,(key_type *)&local_120);
            local_c8.error_message.field_2._M_allocated_capacity =
                 (size_type)
                 (pmVar4->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_c8.error_message._M_dataplus._M_p =
                 (pointer)(pmVar4->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            local_c8.error_message._M_string_length =
                 (size_type)
                 (pmVar4->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (pmVar4->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_118._M_dataplus._M_p;
            (pmVar4->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_118._M_string_length;
            (pmVar4->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)local_118.field_2._M_allocated_capacity;
            local_118._M_dataplus._M_p = (pointer)0x0;
            local_118._M_string_length = 0;
            local_118.field_2._M_allocated_capacity = 0;
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       &local_c8);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       &local_118);
            LogicalType::~LogicalType(&local_e0);
            local_120 = (pointer)((long)&(local_120->_M_dataplus)._M_p + 1);
            sVar5 = best_sql_types_candidates_per_column_idx[6]._M_h._M_element_count;
            sVar7 = *(size_type *)&best_sql_types_candidates_per_column_idx[6]._M_h._M_rehash_policy
            ;
            column_count = (pointer)((long)(sVar7 - sVar5) >> 5);
            col_number = col_number + 1;
          } while (local_120 < column_count);
          local_f0[5].
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = column_count;
          detected_names = local_f0;
        }
        else {
          CSVError::HeaderSniffingError
                    (&local_c8,(CSVReaderOptions *)best_sql_types_candidates_per_column_idx,
                     best_header_row,(idx_t)column_count,
                     (string *)
                     &detected_names[3].
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          CSVErrorHandler::Error(error_handler,&local_c8,false);
          CSVError::~CSVError(&local_c8);
          sVar5 = best_sql_types_candidates_per_column_idx[6]._M_h._M_element_count;
          sVar7 = *(size_type *)&best_sql_types_candidates_per_column_idx[6]._M_h._M_rehash_policy;
        }
      }
      if ((ulong)(*(long *)(this + 8) - *(long *)this) < sVar7 - sVar5) {
        CSVError::HeaderSniffingError
                  (&local_c8,(CSVReaderOptions *)best_sql_types_candidates_per_column_idx,
                   best_header_row,(long)(sVar7 - sVar5) >> 5,
                   (string *)
                   &detected_names[3].
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        CSVErrorHandler::Error(error_handler,&local_c8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.csv_row._M_dataplus._M_p != &local_c8.csv_row.field_2) {
          operator_delete(local_c8.csv_row._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.full_error_message._M_dataplus._M_p != &local_c8.full_error_message.field_2)
        {
          operator_delete(local_c8.full_error_message._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.error_message._M_dataplus._M_p != &local_c8.error_message.field_2) {
          operator_delete(local_c8.error_message._M_dataplus._M_p);
        }
      }
      else if (sVar7 != sVar5) {
        sVar8 = 0;
        do {
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&best_sql_types_candidates_per_column_idx[6]._M_h._M_element_count,sVar8);
          pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)this,sVar8);
          ::std::__cxx11::string::_M_assign((string *)pvVar3);
          sVar8 = sVar8 + 1;
        } while (sVar8 < (ulong)((long)(*(long *)&best_sql_types_candidates_per_column_idx[6]._M_h.
                                                  _M_rehash_policy -
                                       best_sql_types_candidates_per_column_idx[6]._M_h.
                                       _M_element_count) >> 5));
      }
    }
    else {
      uVar2 = *(long *)(this + 8) - *(long *)this >> 5;
      uVar6 = (long)(*(long *)&best_sql_types_candidates_per_column_idx[6]._M_h._M_rehash_policy -
                    best_sql_types_candidates_per_column_idx[6]._M_h._M_element_count) >> 5;
      if (uVar2 < uVar6) {
        uVar6 = uVar2;
      }
      if (uVar6 != 0) {
        sVar8 = 0;
        do {
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&best_sql_types_candidates_per_column_idx[6]._M_h._M_element_count,sVar8);
          pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)this,sVar8);
          ::std::__cxx11::string::_M_assign((string *)pvVar3);
          sVar8 = sVar8 + 1;
          uVar2 = *(long *)(this + 8) - *(long *)this >> 5;
          uVar6 = (long)(*(long *)&best_sql_types_candidates_per_column_idx[6]._M_h._M_rehash_policy
                        - best_sql_types_candidates_per_column_idx[6]._M_h._M_element_count) >> 5;
          if (uVar2 < uVar6) {
            uVar6 = uVar2;
          }
        } while (sVar8 < uVar6);
      }
    }
  }
  return;
}

Assistant:

static void ReplaceNames(vector<string> &detected_names, CSVStateMachine &state_machine,
                         unordered_map<idx_t, vector<LogicalType>> &best_sql_types_candidates_per_column_idx,
                         CSVReaderOptions &options, const MultiFileOptions &file_options,
                         const vector<HeaderValue> &best_header_row, CSVErrorHandler &error_handler) {
	auto &dialect_options = state_machine.dialect_options;
	if (!options.columns_set) {
		if (file_options.hive_partitioning || file_options.union_by_name || options.multi_file_reader) {
			// Just do the replacement
			for (idx_t i = 0; i < MinValue<idx_t>(detected_names.size(), options.name_list.size()); i++) {
				detected_names[i] = options.name_list[i];
			}
			return;
		}
		if (options.name_list.size() > dialect_options.num_cols) {
			if (options.null_padding) {
				// we increase our types
				idx_t col = 0;
				for (idx_t i = dialect_options.num_cols; i < options.name_list.size(); i++) {
					detected_names.push_back(GenerateColumnName(options.name_list.size(), col++));
					best_sql_types_candidates_per_column_idx[i] = {LogicalType::VARCHAR};
				}
				dialect_options.num_cols = options.name_list.size();
			} else {
				// we throw an error
				const auto error = CSVError::HeaderSniffingError(
				    options, best_header_row, options.name_list.size(),
				    state_machine.dialect_options.state_machine_options.delimiter.GetValue());
				error_handler.Error(error);
			}
		}
		if (options.name_list.size() > detected_names.size()) {
			// we throw an error
			const auto error =
			    CSVError::HeaderSniffingError(options, best_header_row, options.name_list.size(),
			                                  state_machine.dialect_options.state_machine_options.delimiter.GetValue());
			error_handler.Error(error);
		} else {
			for (idx_t i = 0; i < options.name_list.size(); i++) {
				detected_names[i] = options.name_list[i];
			}
		}
	}
}